

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_moves(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  uint16_t uVar1;
  int opsize_00;
  uint32_t uVar2;
  TCGv_i32 addr_00;
  TCGv_i32 pTVar3;
  bool bVar4;
  int32_t local_74;
  TCGv_i32 tmp;
  int extend;
  TCGv_i32 addr;
  TCGv_i32 reg;
  uint16_t ext;
  int opsize;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((((s->base).tb)->flags & 0x2000) == 0) {
    gen_exception(s,(s->base).pc_next,8);
  }
  else {
    uVar1 = read_im16(env,s);
    opsize_00 = insn_opsize((uint)insn);
    bVar4 = (uVar1 & 0x8000) == 0;
    if (bVar4) {
      addr = tcg_ctx_00->cpu_dregs[(int)((int)(uint)uVar1 >> 0xc & 7)];
    }
    else {
      addr = get_areg(s,(int)(uint)uVar1 >> 0xc & 7);
    }
    addr_00 = gen_lea(env,s,insn,opsize_00);
    if (addr_00 == tcg_ctx_00->NULL_QREG) {
      gen_addr_fault(s);
    }
    else {
      if ((uVar1 & 0x800) == 0) {
        pTVar3 = gen_load(s,opsize_00,addr_00,0,(uint)((((s->base).tb)->flags & 0x4000) == 0));
        if (bVar4) {
          gen_partset_reg(tcg_ctx_00,opsize_00,addr,pTVar3);
        }
        else {
          gen_ext(tcg_ctx_00,addr,pTVar3,opsize_00,1);
        }
        tcg_temp_free_i32(tcg_ctx_00,pTVar3);
      }
      else {
        gen_store(s,opsize_00,addr_00,addr,(uint)((((s->base).tb)->flags & 0x8000) == 0));
      }
      uVar2 = extract32((uint)insn,3,3);
      if (uVar2 == 3) {
        pTVar3 = get_areg(s,insn & 7);
        if (((insn & 7) == 7) && (opsize_00 == 0)) {
          local_74 = 2;
        }
        else {
          local_74 = opsize_bytes(opsize_00);
        }
        tcg_gen_addi_i32_m68k(tcg_ctx_00,pTVar3,addr_00,local_74);
      }
      else if (uVar2 == 4) {
        pTVar3 = get_areg(s,insn & 7);
        tcg_gen_mov_i32(tcg_ctx_00,pTVar3,addr_00);
      }
    }
  }
  return;
}

Assistant:

DISAS_INSN(moves)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opsize;
    uint16_t ext;
    TCGv reg;
    TCGv addr;
    int extend;

    if (IS_USER(s)) {
        gen_exception(s, s->base.pc_next, EXCP_PRIVILEGE);
        return;
    }

    ext = read_im16(env, s);

    opsize = insn_opsize(insn);

    if (ext & 0x8000) {
        /* address register */
        reg = AREG(ext, 12);
        extend = 1;
    } else {
        /* data register */
        reg = DREG(ext, 12);
        extend = 0;
    }

    addr = gen_lea(env, s, insn, opsize);
    if (IS_NULL_QREG(addr)) {
        gen_addr_fault(s);
        return;
    }

    if (ext & 0x0800) {
        /* from reg to ea */
        gen_store(s, opsize, addr, reg, DFC_INDEX(s));
    } else {
        /* from ea to reg */
        TCGv tmp = gen_load(s, opsize, addr, 0, SFC_INDEX(s));
        if (extend) {
            gen_ext(tcg_ctx, reg, tmp, opsize, 1);
        } else {
            gen_partset_reg(tcg_ctx, opsize, reg, tmp);
        }
        tcg_temp_free(tcg_ctx, tmp);
    }
    switch (extract32(insn, 3, 3)) {
    case 3: /* Indirect postincrement.  */
        tcg_gen_addi_i32(tcg_ctx, AREG(insn, 0), addr,
                         REG(insn, 0) == 7 && opsize == OS_BYTE
                         ? 2
                         : opsize_bytes(opsize));
        break;
    case 4: /* Indirect predecrememnt.  */
        tcg_gen_mov_i32(tcg_ctx, AREG(insn, 0), addr);
        break;
    }
}